

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

Type __thiscall wabt::Func::GetLocalType(Func *this,Index index)

{
  pointer pTVar1;
  pointer ppVar2;
  pointer ppVar3;
  Type TVar4;
  uint uVar5;
  Index i;
  
  pTVar1 = (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar1) >> 3);
  i = index - uVar5;
  if (index < uVar5) {
    return pTVar1[index];
  }
  ppVar3 = (this->local_types).decls_.
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->local_types).decls_.
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar2) {
    uVar5 = 0;
    do {
      uVar5 = uVar5 + ppVar3->second;
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2);
    if (i < uVar5) {
      TVar4 = LocalTypes::operator[](&this->local_types,i);
      return TVar4;
    }
  }
  __assert_fail("index < local_types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/ir.cc",
                0xdb,"Type wabt::Func::GetLocalType(Index) const");
}

Assistant:

Type Func::GetLocalType(Index index) const {
  Index num_params = decl.GetNumParams();
  if (index < num_params) {
    return GetParamType(index);
  } else {
    index -= num_params;
    assert(index < local_types.size());
    return local_types[index];
  }
}